

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O0

ARKodeHAdaptMem arkAdaptInit(void)

{
  ARKodeHAdaptMem hadapt_mem;
  ARKodeHAdaptMem local_8;
  
  local_8 = (ARKodeHAdaptMem)malloc(0xe0);
  if (local_8 == (ARKodeHAdaptMem)0x0) {
    local_8 = (ARKodeHAdaptMem)0x0;
  }
  else {
    memset(local_8,0,0xe0);
    local_8->ehist[0] = 1.0;
    local_8->ehist[1] = 1.0;
    local_8->hhist[0] = 0.0;
    local_8->hhist[1] = 0.0;
    local_8->nst_acc = 0;
    local_8->nst_exp = 0;
  }
  return local_8;
}

Assistant:

ARKodeHAdaptMem arkAdaptInit()
{
  ARKodeHAdaptMem hadapt_mem;

  /* allocate structure */
  hadapt_mem = (ARKodeHAdaptMem) malloc(sizeof(struct ARKodeHAdaptMemRec));
  if (hadapt_mem == NULL)  return(NULL);

  /* initialize values (default parameters are set in arkSetDefaults) */
  memset(hadapt_mem, 0, sizeof(struct ARKodeHAdaptMemRec));
  hadapt_mem->ehist[0] = ONE;
  hadapt_mem->ehist[1] = ONE;
  hadapt_mem->hhist[0] = ZERO;
  hadapt_mem->hhist[1] = ZERO;
  hadapt_mem->nst_acc  = 0;
  hadapt_mem->nst_exp  = 0;
  return(hadapt_mem);
}